

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O3

void __thiscall HEkkDual::majorUpdateFtranFinal(HEkkDual *this)

{
  __atomic_base<int> _Var1;
  double dVar2;
  HVectorBase<double> *this_00;
  HVectorBase<double> *this_01;
  HVector_ptr pHVar3;
  HVector_ptr pHVar4;
  element_type *peVar5;
  pointer pdVar6;
  pointer pdVar7;
  HighsTask *pHVar8;
  HighsSplitDeque *pHVar9;
  uint uVar10;
  uint32_t uVar11;
  MFinish *pMVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  double pivot;
  double *myRow;
  double *pivotArray;
  double *myCol;
  double local_c8;
  long local_c0;
  MFinish *local_b8;
  pointer local_b0;
  TaskGroup local_a8;
  anon_class_24_3_5893e9c0 local_98;
  long local_80;
  pointer local_78;
  pointer local_70;
  double local_68;
  undefined8 uStack_60;
  long *local_50;
  MFinish *local_48;
  undefined8 uStack_40;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x46,0);
  iVar14 = this->multi_nFinish;
  if ((this->dualRHS).workCount < 0) {
    if (0 < iVar14) {
      local_b8 = this->multi_finish;
      local_50 = (long *)__tls_get_addr(&PTR_00441ef0);
      lVar18 = 0;
      do {
        pHVar3 = local_b8[lVar18].col_aq;
        pHVar3->count = -1;
        pHVar4 = local_b8[lVar18].row_ep;
        pHVar4->count = -1;
        local_70 = (pHVar3->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_b0 = (pHVar4->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_c0 = lVar18;
        if (lVar18 != 0) {
          lVar16 = 0;
          do {
            lVar17 = (long)local_b8[lVar16].row_out;
            local_68 = local_b8[lVar16].alpha_row;
            local_78 = ((local_b8[lVar16].col_aq)->array).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pMVar12 = (MFinish *)local_b0[lVar17];
            if (1e-14 < ABS(local_70[lVar17])) {
              uStack_40 = 0;
              local_c8 = local_70[lVar17] / local_68;
              uVar19 = (ulong)this->solver_num_row;
              local_98.myCol = &local_70;
              local_98.pivotArray = &local_78;
              local_48 = pMVar12;
              if ((long)uVar19 < 0x65) {
                local_98.pivot = &local_c8;
                if (0 < this->solver_num_row) {
                  uVar13 = 0;
                  do {
                    local_70[uVar13] = local_70[uVar13] - local_c8 * local_78[uVar13];
                    uVar13 = uVar13 + 1;
                    local_98.pivot = &local_c8;
                  } while (uVar19 != uVar13);
                }
              }
              else {
                local_98.pivot = &local_c8;
                HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
                local_a8.workerDeque = (HighsSplitDeque *)*local_50;
                local_a8.dequeHead = ((local_a8.workerDeque)->ownerData).head;
                local_80 = lVar17;
                do {
                  pHVar9 = local_a8.workerDeque;
                  uVar20 = uVar19 >> 1 & 0x7fffffff;
                  uVar10 = ((local_a8.workerDeque)->ownerData).head;
                  uVar13 = (ulong)uVar10;
                  uVar15 = (uint)uVar19;
                  if (uVar13 < 0x2000) {
                    uVar11 = (uint32_t)(uVar13 + 1);
                    ((local_a8.workerDeque)->ownerData).head = uVar11;
                    ((local_a8.workerDeque)->taskArray)._M_elems[uVar13].metadata.stealer.
                    super___atomic_base<unsigned_long>._M_i = 0;
                    *(undefined ***)((local_a8.workerDeque)->taskArray)._M_elems[uVar13].taskData =
                         &PTR_operator___00441598;
                    *(HighsInt *)(((local_a8.workerDeque)->taskArray)._M_elems[uVar13].taskData + 8)
                         = (HighsInt)uVar20;
                    *(uint *)(((local_a8.workerDeque)->taskArray)._M_elems[uVar13].taskData + 0xc) =
                         uVar15;
                    pHVar8 = ((local_a8.workerDeque)->taskArray)._M_elems + uVar13;
                    pHVar8->taskData[0x10] = 'd';
                    pHVar8->taskData[0x11] = '\0';
                    pHVar8->taskData[0x12] = '\0';
                    pHVar8->taskData[0x13] = '\0';
                    *(anon_class_24_3_5893e9c0 **)
                     (((local_a8.workerDeque)->taskArray)._M_elems[uVar13].taskData + 0x18) =
                         &local_98;
                    if (((local_a8.workerDeque)->ownerData).allStolenCopy == true) {
                      ((local_a8.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>.
                      _M_i = uVar13 << 0x20 | uVar13 + 1;
                      ((local_a8.workerDeque)->stealerData).allStolen._M_base._M_i = false;
                      ((local_a8.workerDeque)->ownerData).splitCopy = uVar11;
                      ((local_a8.workerDeque)->ownerData).allStolenCopy = false;
                      if ((((local_a8.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                        ((local_a8.workerDeque)->splitRequest)._M_base._M_i = false;
                      }
                      peVar5 = ((local_a8.workerDeque)->ownerData).workerBunk.
                               super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      LOCK();
                      _Var1._M_i = (peVar5->haveJobs).super___atomic_base<int>._M_i;
                      (peVar5->haveJobs).super___atomic_base<int>._M_i =
                           (peVar5->haveJobs).super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                      if (_Var1._M_i < ((local_a8.workerDeque)->ownerData).numWorkers + -1) {
                        HighsSplitDeque::WorkerBunk::publishWork
                                  (((local_a8.workerDeque)->ownerData).workerBunk.
                                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,local_a8.workerDeque);
                      }
                    }
                    else {
                      HighsSplitDeque::growShared(local_a8.workerDeque);
                    }
                  }
                  else {
                    if ((((local_a8.workerDeque)->ownerData).splitCopy < 0x2000) &&
                       (((local_a8.workerDeque)->ownerData).allStolenCopy == false)) {
                      HighsSplitDeque::growShared(local_a8.workerDeque);
                      uVar10 = (pHVar9->ownerData).head;
                    }
                    (pHVar9->ownerData).head = uVar10 + 1;
                    ::highs::parallel::for_each<HEkkDual::majorUpdateFtranFinal()::__0&>
                              ((HighsInt)uVar20,uVar15,&local_98,100);
                  }
                  uVar19 = uVar20;
                } while (0xc9 < uVar15);
                if (1 < uVar15) {
                  pdVar6 = *local_98.pivotArray;
                  pdVar7 = *local_98.myCol;
                  uVar19 = 0;
                  do {
                    pdVar7[uVar19] = pdVar7[uVar19] - *local_98.pivot * pdVar6[uVar19];
                    uVar19 = uVar19 + 1;
                  } while (uVar20 != uVar19);
                }
                ::highs::parallel::TaskGroup::taskWait(&local_a8);
                lVar17 = local_80;
                lVar18 = local_c0;
                ::highs::parallel::TaskGroup::~TaskGroup(&local_a8);
              }
              local_70[lVar17] = local_c8;
              pMVar12 = local_48;
            }
            if (1e-14 < ABS((double)pMVar12)) {
              local_c8 = (double)pMVar12 / local_68;
              uVar19 = (ulong)this->solver_num_row;
              local_98.myCol = &local_b0;
              local_98.pivotArray = &local_78;
              if ((long)uVar19 < 0x65) {
                local_98.pivot = &local_c8;
                if (0 < this->solver_num_row) {
                  uVar13 = 0;
                  do {
                    local_b0[uVar13] = local_b0[uVar13] - local_c8 * local_78[uVar13];
                    uVar13 = uVar13 + 1;
                    local_98.pivot = &local_c8;
                  } while (uVar19 != uVar13);
                }
              }
              else {
                local_98.pivot = &local_c8;
                local_80 = lVar17;
                HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
                local_a8.workerDeque = (HighsSplitDeque *)*local_50;
                local_a8.dequeHead = ((local_a8.workerDeque)->ownerData).head;
                do {
                  pHVar9 = local_a8.workerDeque;
                  uVar20 = uVar19 >> 1 & 0x7fffffff;
                  uVar10 = ((local_a8.workerDeque)->ownerData).head;
                  uVar13 = (ulong)uVar10;
                  uVar15 = (uint)uVar19;
                  if (uVar13 < 0x2000) {
                    uVar11 = (uint32_t)(uVar13 + 1);
                    ((local_a8.workerDeque)->ownerData).head = uVar11;
                    ((local_a8.workerDeque)->taskArray)._M_elems[uVar13].metadata.stealer.
                    super___atomic_base<unsigned_long>._M_i = 0;
                    *(undefined ***)((local_a8.workerDeque)->taskArray)._M_elems[uVar13].taskData =
                         &PTR_operator___004415f8;
                    *(HighsInt *)(((local_a8.workerDeque)->taskArray)._M_elems[uVar13].taskData + 8)
                         = (HighsInt)uVar20;
                    *(uint *)(((local_a8.workerDeque)->taskArray)._M_elems[uVar13].taskData + 0xc) =
                         uVar15;
                    pHVar8 = ((local_a8.workerDeque)->taskArray)._M_elems + uVar13;
                    pHVar8->taskData[0x10] = 'd';
                    pHVar8->taskData[0x11] = '\0';
                    pHVar8->taskData[0x12] = '\0';
                    pHVar8->taskData[0x13] = '\0';
                    *(anon_class_24_3_5893e9c0 **)
                     (((local_a8.workerDeque)->taskArray)._M_elems[uVar13].taskData + 0x18) =
                         &local_98;
                    if (((local_a8.workerDeque)->ownerData).allStolenCopy == true) {
                      ((local_a8.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>.
                      _M_i = uVar13 << 0x20 | uVar13 + 1;
                      ((local_a8.workerDeque)->stealerData).allStolen._M_base._M_i = false;
                      ((local_a8.workerDeque)->ownerData).splitCopy = uVar11;
                      ((local_a8.workerDeque)->ownerData).allStolenCopy = false;
                      if ((((local_a8.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                        ((local_a8.workerDeque)->splitRequest)._M_base._M_i = false;
                      }
                      peVar5 = ((local_a8.workerDeque)->ownerData).workerBunk.
                               super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      LOCK();
                      _Var1._M_i = (peVar5->haveJobs).super___atomic_base<int>._M_i;
                      (peVar5->haveJobs).super___atomic_base<int>._M_i =
                           (peVar5->haveJobs).super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                      if (_Var1._M_i < ((local_a8.workerDeque)->ownerData).numWorkers + -1) {
                        HighsSplitDeque::WorkerBunk::publishWork
                                  (((local_a8.workerDeque)->ownerData).workerBunk.
                                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,local_a8.workerDeque);
                      }
                    }
                    else {
                      HighsSplitDeque::growShared(local_a8.workerDeque);
                    }
                  }
                  else {
                    if ((((local_a8.workerDeque)->ownerData).splitCopy < 0x2000) &&
                       (((local_a8.workerDeque)->ownerData).allStolenCopy == false)) {
                      HighsSplitDeque::growShared(local_a8.workerDeque);
                      uVar10 = (pHVar9->ownerData).head;
                    }
                    (pHVar9->ownerData).head = uVar10 + 1;
                    ::highs::parallel::for_each<HEkkDual::majorUpdateFtranFinal()::__1&>
                              ((HighsInt)uVar20,uVar15,(anon_class_24_3_5967739a *)&local_98,100);
                  }
                  uVar19 = uVar20;
                } while (0xc9 < uVar15);
                if (1 < uVar15) {
                  pdVar6 = *local_98.pivotArray;
                  pdVar7 = *local_98.myCol;
                  uVar19 = 0;
                  do {
                    pdVar7[uVar19] = pdVar7[uVar19] - *local_98.pivot * pdVar6[uVar19];
                    uVar19 = uVar19 + 1;
                  } while (uVar20 != uVar19);
                }
                ::highs::parallel::TaskGroup::taskWait(&local_a8);
                lVar17 = local_80;
                lVar18 = local_c0;
                ::highs::parallel::TaskGroup::~TaskGroup(&local_a8);
              }
              local_b0[lVar17] = local_c8;
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != lVar18);
          iVar14 = this->multi_nFinish;
        }
        lVar18 = local_c0 + 1;
      } while (lVar18 < iVar14);
    }
  }
  else if (0 < iVar14) {
    local_48 = this->multi_finish;
    lVar18 = 0;
    pMVar12 = (MFinish *)0x0;
    do {
      if (pMVar12 != (MFinish *)0x0) {
        this_00 = local_48[(long)pMVar12].row_ep;
        this_01 = local_48[(long)pMVar12].col_aq;
        lVar16 = 0;
        local_b8 = pMVar12;
        do {
          iVar14 = *(int *)((long)&this->multi_finish[0].row_out + lVar16);
          dVar2 = (this_01->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar14];
          if (1e-14 < ABS(dVar2)) {
            local_68 = dVar2 / *(double *)((long)&this->multi_finish[0].alpha_row + lVar16);
            uStack_60 = 0;
            HVectorBase<double>::saxpy<double,double>
                      (this_01,-local_68,
                       *(HVectorBase<double> **)((long)&this->multi_finish[0].col_aq + lVar16));
            (this_01->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar14] = local_68;
          }
          dVar2 = (this_00->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar14];
          if (1e-14 < ABS(dVar2)) {
            local_68 = dVar2 / *(double *)((long)&this->multi_finish[0].alpha_row + lVar16);
            uStack_60 = 0;
            HVectorBase<double>::saxpy<double,double>
                      (this_00,-local_68,
                       *(HVectorBase<double> **)((long)&this->multi_finish[0].col_aq + lVar16));
            (this_00->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar14] = local_68;
          }
          lVar16 = lVar16 + 0x78;
        } while (lVar18 != lVar16);
        iVar14 = this->multi_nFinish;
        pMVar12 = local_b8;
      }
      pMVar12 = (MFinish *)&pMVar12->field_0x1;
      lVar18 = lVar18 + 0x78;
    } while ((long)pMVar12 < (long)iVar14);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x46,0);
  return;
}

Assistant:

void HEkkDual::majorUpdateFtranFinal() {
  analysis->simplexTimerStart(FtranMixFinalClock);
  HighsInt updateFTRAN_inDense = dualRHS.workCount < 0;
  if (updateFTRAN_inDense) {
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      multi_finish[iFn].col_aq->count = -1;
      multi_finish[iFn].row_ep->count = -1;
      double* myCol = multi_finish[iFn].col_aq->array.data();
      double* myRow = multi_finish[iFn].row_ep->array.data();
      for (HighsInt jFn = 0; jFn < iFn; jFn++) {
        HighsInt pivotRow = multi_finish[jFn].row_out;
        const double pivotAlpha = multi_finish[jFn].alpha_row;
        const double* pivotArray = multi_finish[jFn].col_aq->array.data();
        double pivotX1 = myCol[pivotRow];
        double pivotX2 = myRow[pivotRow];

        // The FTRAN regular buffer
        if (fabs(pivotX1) > kHighsTiny) {
          const double pivot = pivotX1 / pivotAlpha;
          // #pragma omp parallel for
          highs::parallel::for_each(
              0, solver_num_row,
              [&](HighsInt start, HighsInt end) {
                for (HighsInt i = start; i < end; i++)
                  myCol[i] -= pivot * pivotArray[i];
              },
              100);
          myCol[pivotRow] = pivot;
        }
        // The FTRAN-DSE buffer
        if (fabs(pivotX2) > kHighsTiny) {
          const double pivot = pivotX2 / pivotAlpha;
          // #pragma omp parallel for
          highs::parallel::for_each(
              0, solver_num_row,
              [&](HighsInt start, HighsInt end) {
                for (HighsInt i = start; i < end; i++)
                  myRow[i] -= pivot * pivotArray[i];
              },
              100);
          myRow[pivotRow] = pivot;
        }
      }
    }
  } else {
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      MFinish* finish = &multi_finish[iFn];
      HVector* Col = finish->col_aq;
      HVector* Row = finish->row_ep;
      for (HighsInt jFn = 0; jFn < iFn; jFn++) {
        MFinish* jFinish = &multi_finish[jFn];
        HighsInt pivotRow = jFinish->row_out;
        double pivotX1 = Col->array[pivotRow];
        // The FTRAN regular buffer
        if (fabs(pivotX1) > kHighsTiny) {
          pivotX1 /= jFinish->alpha_row;
          Col->saxpy(-pivotX1, jFinish->col_aq);
          Col->array[pivotRow] = pivotX1;
        }
        // The FTRAN-DSE buffer
        double pivotX2 = Row->array[pivotRow];
        if (fabs(pivotX2) > kHighsTiny) {
          pivotX2 /= jFinish->alpha_row;
          Row->saxpy(-pivotX2, jFinish->col_aq);
          Row->array[pivotRow] = pivotX2;
        }
      }
    }
  }
  analysis->simplexTimerStop(FtranMixFinalClock);
}